

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O1

void __thiscall Qentem::QExpression::operator-=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  QExpression *pQVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 in_ZMM0 [64];
  
  EVar1 = this->Type;
  if (EVar1 == RealNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      dVar4 = *(double *)&this->field_0 - *(double *)&right->field_0;
    }
    else {
      if (EVar1 == IntegerNumber) {
        dVar4 = (double)(long)(right->field_0).SubExpressions.storage_;
      }
      else {
        if (EVar1 != NaturalNumber) {
          return;
        }
        auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(right->field_0).SubExpressions.storage_);
        dVar4 = auVar3._0_8_;
      }
      dVar4 = *(double *)&this->field_0 - dVar4;
    }
    *(double *)&this->field_0 = dVar4;
  }
  else if (EVar1 == IntegerNumber) {
    if (right->Type - 2 < 2) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)(this->field_0).SubExpressions.storage_ -
           (long)(right->field_0).SubExpressions.storage_);
      return;
    }
    if (right->Type == RealNumber) {
      dVar4 = (double)(long)(this->field_0).SubExpressions.storage_;
LAB_00115dd4:
      *(double *)&this->field_0 = dVar4 - *(double *)&right->field_0;
      this->Type = RealNumber;
      return;
    }
  }
  else if (EVar1 == NaturalNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(this->field_0).SubExpressions.storage_);
      dVar4 = auVar3._0_8_;
      goto LAB_00115dd4;
    }
    if (EVar1 == IntegerNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)(this->field_0).SubExpressions.storage_ -
           (long)(right->field_0).SubExpressions.storage_);
      this->Type = IntegerNumber;
      return;
    }
    if (EVar1 == NaturalNumber) {
      pQVar2 = (this->field_0).SubExpressions.storage_;
      if (pQVar2 < (right->field_0).SubExpressions.storage_) {
        this->Type = IntegerNumber;
      }
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)((long)pQVar2 - (long)(right->field_0).SubExpressions.storage_);
      return;
    }
  }
  return;
}

Assistant:

void operator-=(const QExpression &right) noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber: {
                        if (Value.Number.Natural < right.Value.Number.Natural) {
                            Type = ExpressionType::IntegerNumber;
                        }

                        Value.Number.Natural -= right.Value.Number.Natural;
                        break;
                    }

                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer -= right.Value.Number.Integer;
                        Type = ExpressionType::IntegerNumber;

                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real = (double(Value.Number.Natural) - right.Value.Number.Real);
                        Type              = ExpressionType::RealNumber;
                        break;
                    }

                    default: {
                    }
                }

                break;
            }

            case ExpressionType::IntegerNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber:
                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer -= right.Value.Number.Integer;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real = (double(Value.Number.Integer) - right.Value.Number.Real);
                        Type              = ExpressionType::RealNumber;
                        break;
                    }

                    default: {
                    }
                }

                break;
            }

            case ExpressionType::RealNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber: {
                        Value.Number.Real -= double(right.Value.Number.Natural);
                        break;
                    }

                    case ExpressionType::IntegerNumber: {
                        Value.Number.Real -= double(right.Value.Number.Integer);
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real -= right.Value.Number.Real;
                    }

                    default: {
                    }
                }
            }

            default: {
            }
        }
    }